

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O0

void __thiscall
Fixpp::impl::FieldGroupVisitor<Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>>::operator()
          (FieldGroupVisitor<Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>> *this,
          FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_> *field,ParsingContext *context,
          TagSet<Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
          *param_3,bool param_4,bool param_5)

{
  StreamCursor *cursor_00;
  bool bVar1;
  undefined1 local_70 [8];
  pair<const_char_*,_unsigned_long> view;
  Token valueToken;
  StreamCursor *cursor;
  bool param_6_local;
  bool param_5_local;
  TagSet<Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
  *param_4_local;
  ParsingContext *context_local;
  FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_> *field_local;
  FieldGroupVisitor<Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>_> *this_local;
  
  cursor_00 = context->cursor;
  StreamCursor::Token::Token((Token *)&view.second,cursor_00);
  bVar1 = match_until_fast('|',cursor_00);
  if (bVar1) {
    _local_70 = StreamCursor::Token::view((Token *)&view.second);
    FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>::set(field,(View *)local_70);
  }
  else {
    ParsingContext::setError(context,ParsingError,"Expected value after tag %d, got EOF",0x163);
  }
  return;
}

Assistant:

void operator()(Field& field,
                            ParsingContext& context, TagSet&, bool, bool)
            {
                static constexpr auto Tag = Field::Tag::Id;
                auto& cursor = context.cursor;

                StreamCursor::Token valueToken(cursor);
                TRY_MATCH_UNTIL(SOH, "Expected value after tag %d, got EOF", Tag);

                auto view = valueToken.view();

                field.set(view);
            }